

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImGuiID id_00;
  ImGuiWindow *window_00;
  ImGuiColumns *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float width;
  float offset_1;
  float offset_0;
  ImVec2 local_88;
  float local_80;
  float local_7c;
  float clip_x2;
  float clip_x1;
  ImGuiColumnData *column_1;
  undefined1 local_68 [4];
  int n_1;
  ImGuiColumnData column;
  int n;
  float max_2;
  float max_1;
  float half_clip_extend_x;
  float column_padding;
  ImGuiColumns *columns;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiColumnsFlags flags_local;
  int columns_count_local;
  char *str_id_local;
  
  pIVar2 = GImGui;
  window_00 = GetCurrentWindow();
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui_widgets.cpp"
                  ,0x1c87,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((window_00->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    __assert_fail("window->DC.CurrentColumns == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui_widgets.cpp"
                  ,0x1c88,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  id_00 = GetColumnsID(str_id,columns_count);
  pIVar3 = FindOrCreateColumns(window_00,id_00);
  if (pIVar3->ID != id_00) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui_widgets.cpp"
                  ,0x1c8d,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  pIVar3->Current = 0;
  pIVar3->Count = columns_count;
  pIVar3->Flags = flags;
  (window_00->DC).CurrentColumns = pIVar3;
  pIVar3->HostCursorPosY = (window_00->DC).CursorPos.y;
  pIVar3->HostCursorMaxPosX = (window_00->DC).CursorMaxPos.x;
  (pIVar3->HostClipRect).Min = (window_00->ClipRect).Min;
  (pIVar3->HostClipRect).Max = (window_00->ClipRect).Max;
  (pIVar3->HostWorkRect).Min = (window_00->WorkRect).Min;
  (pIVar3->HostWorkRect).Max = (window_00->WorkRect).Max;
  fVar1 = (pIVar2->Style).ItemSpacing.x;
  fVar4 = ImMax<float>((window_00->WindowPadding).x * 0.5,window_00->WindowBorderSize);
  fVar5 = ImFloor(fVar4);
  fVar4 = (window_00->WorkRect).Max.x;
  fVar6 = ImMax<float>(fVar1 - (window_00->WindowPadding).x,0.0);
  column.ClipRect.Max.y = (window_00->WorkRect).Max.x + fVar5;
  fVar5 = (window_00->DC).Indent.x;
  fVar7 = ImMax<float>(fVar1 - (window_00->WindowPadding).x,0.0);
  pIVar3->OffMinX = (fVar5 - fVar1) + fVar7;
  fVar4 = ImMin<float>((fVar4 + fVar1) - fVar6,column.ClipRect.Max.y);
  fVar4 = ImMax<float>(fVar4 - (window_00->Pos).x,pIVar3->OffMinX + 1.0);
  pIVar3->OffMaxX = fVar4;
  fVar4 = (window_00->DC).CursorPos.y;
  pIVar3->LineMaxY = fVar4;
  pIVar3->LineMinY = fVar4;
  if (((pIVar3->Columns).Size != 0) && ((pIVar3->Columns).Size != columns_count + 1)) {
    ImVector<ImGuiColumnData>::resize(&pIVar3->Columns,0);
  }
  pIVar3->IsFirstFrame = (pIVar3->Columns).Size == 0;
  if ((pIVar3->Columns).Size == 0) {
    ImVector<ImGuiColumnData>::reserve(&pIVar3->Columns,columns_count + 1);
    for (column.ClipRect.Max.x = 0.0; (int)column.ClipRect.Max.x < columns_count + 1;
        column.ClipRect.Max.x = (float)((int)column.ClipRect.Max.x + 1)) {
      ImGuiColumnData::ImGuiColumnData((ImGuiColumnData *)local_68);
      local_68 = (undefined1  [4])((float)(int)column.ClipRect.Max.x / (float)columns_count);
      ImVector<ImGuiColumnData>::push_back(&pIVar3->Columns,(ImGuiColumnData *)local_68);
    }
  }
  for (column_1._4_4_ = 0; column_1._4_4_ < columns_count; column_1._4_4_ = column_1._4_4_ + 1) {
    _clip_x2 = ImVector<ImGuiColumnData>::operator[](&pIVar3->Columns,column_1._4_4_);
    fVar4 = (window_00->Pos).x;
    fVar5 = GetColumnOffset(column_1._4_4_);
    local_7c = ImFloor(fVar4 + 0.5 + fVar5);
    fVar4 = (window_00->Pos).x;
    fVar5 = GetColumnOffset(column_1._4_4_ + 1);
    local_80 = ImFloor((fVar4 + 0.5 + fVar5) - 1.0);
    ImRect::ImRect((ImRect *)&offset_1,local_7c,-3.4028235e+38,local_80,3.4028235e+38);
    (_clip_x2->ClipRect).Min = _offset_1;
    (_clip_x2->ClipRect).Max = local_88;
    ImRect::ClipWith(&_clip_x2->ClipRect,&window_00->ClipRect);
  }
  if (1 < pIVar3->Count) {
    ImDrawList::ChannelsSplit(window_00->DrawList,pIVar3->Count + 1);
    ImDrawList::ChannelsSetCurrent(window_00->DrawList,1);
    PushColumnClipRect(0);
  }
  fVar4 = GetColumnOffset(pIVar3->Current);
  fVar5 = GetColumnOffset(pIVar3->Current + 1);
  PushItemWidth((fVar5 - fVar4) * 0.65);
  fVar4 = ImMax<float>(fVar1 - (window_00->WindowPadding).x,0.0);
  (window_00->DC).ColumnsOffset.x = fVar4;
  (window_00->DC).CursorPos.x =
       (float)(int)((window_00->Pos).x + (window_00->DC).Indent.x + (window_00->DC).ColumnsOffset.x)
  ;
  (window_00->WorkRect).Max.x = ((window_00->Pos).x + fVar5) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL); // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n));
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        window->DrawList->ChannelsSplit(1 + columns->Count);
        window->DrawList->ChannelsSetCurrent(1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}